

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIO.cpp
# Opt level: O0

void __thiscall Imf_3_4::IStream::~IStream(IStream *this)

{
  code *pcVar1;
  IStream *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

IStream::~IStream ()
{
    // empty
}